

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

bool __thiscall QRowsRemoval::contains(QRowsRemoval *this,QModelIndex parent,int row)

{
  long lVar1;
  bool bVar2;
  int in_ESI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  int local_34;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = in_ESI;
  do {
    bVar2 = ::operator==((QModelIndex *)
                         CONCAT17(in_stack_ffffffffffffffb7,
                                  CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                         in_stack_ffffffffffffffa8);
    if (bVar2) {
      local_21 = false;
      if (in_RDI[1].r <= local_34) {
        local_21 = local_34 <= in_RDI[1].c;
      }
      goto LAB_0087f767;
    }
    local_34 = QModelIndex::row((QModelIndex *)&stack0x00000008);
    QModelIndex::parent(in_RDI);
  } while (-1 < local_34);
  local_21 = false;
LAB_0087f767:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool contains(QModelIndex parent, int row) const
    {
        do {
            if (parent == parent_source)
                return row >= start && row <= end;
            row = parent.row();
            parent = parent.parent();
        } while (row >= 0);
        return false;
    }